

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDateTest.cpp
# Opt level: O2

int PDFDateTest(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  tm *ptVar3;
  time_t tVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  PDFDate currentDate;
  string mytime;
  PDFDate local_4f8;
  PDFDate local_4c8;
  PDFDate dayDate;
  PDFDate yearDate;
  time_t time_local;
  PDFDate emptyDate;
  char strtime_buff [1024];
  
  PDFDate::PDFDate(&emptyDate);
  PDFDate::ToString_abi_cxx11_((string *)strtime_buff,&emptyDate);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          strtime_buff,"");
  std::__cxx11::string::~string((string *)strtime_buff);
  iVar8 = 0;
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"wrong string conversion for empty date - ");
    PDFDate::ToString_abi_cxx11_((string *)strtime_buff,&emptyDate);
    poVar2 = std::operator<<(poVar2,(char *)strtime_buff._0_8_);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)strtime_buff);
    iVar8 = -1;
  }
  PDFDate::PDFDate(&yearDate);
  yearDate.Year = 0x7c0;
  PDFDate::ToString_abi_cxx11_((string *)strtime_buff,&yearDate);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          strtime_buff,"D:1984");
  std::__cxx11::string::~string((string *)strtime_buff);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"wrong string conversion for year date - ");
    PDFDate::ToString_abi_cxx11_((string *)strtime_buff,&yearDate);
    poVar2 = std::operator<<(poVar2,(char *)strtime_buff._0_8_);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)strtime_buff);
    iVar8 = -1;
  }
  PDFDate::PDFDate(&dayDate);
  dayDate.Year = 0x7c0;
  dayDate.Month = 4;
  dayDate.Day = 3;
  PDFDate::ToString_abi_cxx11_((string *)strtime_buff,&dayDate);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          strtime_buff,"D:19840403");
  std::__cxx11::string::~string((string *)strtime_buff);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"wrong string conversion for day date - ");
    PDFDate::ToString_abi_cxx11_((string *)strtime_buff,&dayDate);
    poVar2 = std::operator<<(poVar2,(char *)strtime_buff._0_8_);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)strtime_buff);
    iVar8 = -1;
  }
  PDFDate::PDFDate(&local_4c8);
  local_4c8.Year = 0x7c0;
  local_4c8.Month = 4;
  local_4c8.Day = 3;
  local_4c8.Hour = 0x12;
  local_4c8.Minute = 0x1e;
  local_4c8.Second = 0x2d;
  PDFDate::ToString_abi_cxx11_((string *)strtime_buff,&local_4c8);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          strtime_buff,"D:19840403183045");
  std::__cxx11::string::~string((string *)strtime_buff);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"wrong string conversion for local date - ");
    PDFDate::ToString_abi_cxx11_((string *)strtime_buff,&local_4c8);
    poVar2 = std::operator<<(poVar2,(char *)strtime_buff._0_8_);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)strtime_buff);
    iVar8 = -1;
  }
  PDFDate::PDFDate(&local_4f8);
  local_4f8.Year = 0x7c0;
  local_4f8.Month = 4;
  local_4f8.Day = 3;
  local_4f8.Hour = 0x12;
  local_4f8.Minute = 0x1e;
  local_4f8.Second = 0x2d;
  local_4f8.UTC = eEarlier;
  local_4f8.HourFromUTC = 2;
  local_4f8.MinuteFromUTC = 0;
  PDFDate::ToString_abi_cxx11_((string *)strtime_buff,&local_4f8);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          strtime_buff,"D:19840403183045-02\'00\'");
  std::__cxx11::string::~string((string *)strtime_buff);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"wrong string conversion for full date - ");
    PDFDate::ToString_abi_cxx11_((string *)strtime_buff,&local_4f8);
    poVar2 = std::operator<<(poVar2,(char *)strtime_buff._0_8_);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)strtime_buff);
    iVar8 = -1;
  }
  PDFDate::PDFDate(&currentDate);
  PDFDate::SetToCurrentTime(&currentDate);
  poVar2 = std::operator<<((ostream *)&std::cout,"Current time as represented in PDFDate - ");
  PDFDate::ToString_abi_cxx11_((string *)strtime_buff,&currentDate);
  poVar2 = std::operator<<(poVar2,(char *)strtime_buff._0_8_);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)strtime_buff);
  time_local = time((time_t *)0x0);
  ptVar3 = gmtime(&time_local);
  ptVar3->tm_isdst = -1;
  tVar4 = mktime(ptVar3);
  ptVar3 = localtime(&time_local);
  iVar6 = (int)time_local;
  mytime._M_dataplus._M_p = (pointer)&mytime.field_2;
  mytime._M_string_length = 0;
  mytime.field_2._M_local_buf[0] = '\0';
  strftime(strtime_buff,0x400,"D:%Y%m%d%H%M%S",ptVar3);
  std::__cxx11::string::assign((char *)&mytime);
  iVar6 = iVar6 - (int)tVar4;
  std::__cxx11::string::append((char *)&mytime);
  sprintf(strtime_buff,"%02d\'%02d\'",(long)iVar6 / 0xe10 & 0xffffffff,
          (long)iVar6 % 0xe10 & 0xffffffff);
  std::__cxx11::string::append((char *)&mytime);
  poVar2 = std::operator<<((ostream *)&std::cout,"Current system time using time_t is    - ");
  poVar2 = std::operator<<(poVar2,(string *)&mytime);
  std::operator<<(poVar2,"\n");
  if (iVar6 == 0) {
    std::operator<<((ostream *)&std::cout,
                    " --> timezone test skipped as it\'s utc, you should change your timezone and try again. \n"
                   );
  }
  else {
    iVar5 = currentDate.MinuteFromUTC * 0x3c + currentDate.HourFromUTC * 0xe10;
    iVar7 = -iVar5;
    if (currentDate.UTC != eEarlier) {
      iVar7 = iVar5;
    }
    if (iVar7 != iVar6) {
      poVar2 = std::operator<<((ostream *)&std::cout,"timezone does not match!\n");
      poVar2 = std::operator<<(poVar2," -> time_t    calculated: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar6);
      poVar2 = std::operator<<(poVar2," (secs from UTC)\n");
      poVar2 = std::operator<<(poVar2," -> PDFHummus calculated: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar7);
      std::operator<<(poVar2,"  (secs from UTC)\n");
      iVar8 = -1;
    }
  }
  std::__cxx11::string::~string((string *)&mytime);
  PDFDate::~PDFDate(&currentDate);
  PDFDate::~PDFDate(&local_4f8);
  PDFDate::~PDFDate(&local_4c8);
  PDFDate::~PDFDate(&dayDate);
  PDFDate::~PDFDate(&yearDate);
  PDFDate::~PDFDate(&emptyDate);
  return (int)(iVar8 != 0);
}

Assistant:

int PDFDateTest(int argc, char* argv[])
{
	EStatusCode status = PDFHummus::eSuccess;

	// Empty Date
	PDFDate emptyDate;
	if(emptyDate.ToString() != "")
	{
		status = PDFHummus::eFailure;
		cout<<"wrong string conversion for empty date - "<<emptyDate.ToString().c_str()<<"\n";
	}

	// Year only Date
	PDFDate yearDate;
	yearDate.Year = 1984;
	if(yearDate.ToString() != "D:1984")
	{
		status = PDFHummus::eFailure;
		cout<<"wrong string conversion for year date - "<<yearDate.ToString().c_str()<<"\n";
	}

	// Day only Date
	PDFDate dayDate;
	dayDate.Year = 1984;
	dayDate.Month = 4;
	dayDate.Day = 3;
	if(dayDate.ToString() != "D:19840403")
	{
		status = PDFHummus::eFailure;
		cout<<"wrong string conversion for day date - "<<dayDate.ToString().c_str()<<"\n";
	}
	// local Time Date
	PDFDate localTimeDate;
	localTimeDate.Year = 1984;
	localTimeDate.Month = 4;
	localTimeDate.Day = 3;
	localTimeDate.Hour = 18;
	localTimeDate.Minute = 30;
	localTimeDate.Second = 45;
	if(localTimeDate.ToString() != "D:19840403183045")
	{
		status = PDFHummus::eFailure;
		cout<<"wrong string conversion for local date - "<<localTimeDate.ToString().c_str()<<"\n";
	}
	// Fully qualified Time date
	PDFDate fullDate;
	fullDate.Year = 1984;
	fullDate.Month = 4;
	fullDate.Day = 3;
	fullDate.Hour = 18;
	fullDate.Minute = 30;
	fullDate.Second = 45;
	fullDate.UTC = PDFDate::eEarlier;
	fullDate.HourFromUTC = 2;
	fullDate.MinuteFromUTC = 0;
	if(fullDate.ToString() != "D:19840403183045-02'00'")
	{
		status = PDFHummus::eFailure;
		cout<<"wrong string conversion for full date - "<<fullDate.ToString().c_str()<<"\n";
	}

	// Just display the current time as set by PDFDate
	PDFDate currentDate;
	currentDate.SetToCurrentTime();
	cout<<"Current time as represented in PDFDate - "<<currentDate.ToString().c_str()<<"\n";

	{
		// time structs
		time_t  time_local			= time(NULL);
		tm * my_utc_time			= gmtime(&time_local);
		my_utc_time->tm_isdst = -1; // automatic dst
		time_t time_utc				= mktime(my_utc_time);
		tm *my_local_time			= std::localtime(&time_local);
		int timezone_difference		= (long)(time_local - time_utc);
		
		// buffers/text
		const int strtime_buffsize = 1024;
		char strtime_buff[strtime_buffsize];
		string mytime;

		std::strftime(strtime_buff
			, strtime_buffsize
			, "D:%Y%m%d%H%M%S"
			, my_local_time);
		
		// PDF-style time representation. (It's just information)
		mytime = strtime_buff;
		mytime.append(timezone_difference >= 0 ? "+" : "-");
		sprintf(strtime_buff, "%02d'%02d'"
			, (int)(timezone_difference / 3600)
			, timezone_difference % 3600);
		mytime.append(strtime_buff);
		// padd "Current time as represented in PDFDate - "
		cout << "Current system time using time_t is    - " << mytime << "\n";

		// we can't test if it's UTC+0
		if (timezone_difference == 0){
			cout << " --> timezone test skipped as it's utc, you should change your timezone and try again. \n";
		}
		else{
			// calc timezone offset according to PDFHummus
			int PDFTimezone_diff = (currentDate.UTC == PDFDate::eEarlier ? -1 : 1)
				* ((currentDate.HourFromUTC * 3600) + currentDate.MinuteFromUTC * 60);
			
			// compare.
			if (PDFTimezone_diff != timezone_difference){
				status = PDFHummus::eFailure;
				cout << "timezone does not match!\n" <<
					" -> time_t    calculated: " << timezone_difference << " (secs from UTC)\n" <<
					" -> PDFHummus calculated: " << PDFTimezone_diff << "  (secs from UTC)\n";
			}

		}
	}



	return status == eSuccess ? 0:1;
}